

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O1

void nk_glfw3_clipboard_copy(nk_handle usr,char *text,int len)

{
  char *string;
  size_t __n;
  
  if (len != 0) {
    __n = (size_t)len;
    string = (char *)malloc(__n + 1);
    if (string != (char *)0x0) {
      memcpy(string,text,__n);
      string[__n] = '\0';
      glfwSetClipboardString(*usr.ptr,string);
      free(string);
      return;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_glfw3_clipboard_copy(nk_handle usr, const char *text, int len)
{
    char *str = 0;
    if (!len) return;
    str = (char*)malloc((size_t)len+1);
    if (!str) return;
    memcpy(str, text, (size_t)len);
    str[len] = '\0';
    struct nk_glfw* glfw = usr.ptr;
    glfwSetClipboardString(glfw->win, str);
    free(str);
}